

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_data.cc
# Opt level: O3

string * GetTestData_abi_cxx11_(string *__return_storage_ptr__,char *path)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  FILE *__stream;
  undefined8 extraout_RAX;
  char *__s;
  string full_path;
  char buf [512];
  long *local_248 [2];
  long local_238 [2];
  undefined1 local_228 [512];
  
  pcVar2 = getenv("BORINGSSL_TEST_DATA_ROOT");
  __s = ".";
  if (pcVar2 != (char *)0x0) {
    __s = pcVar2;
  }
  local_248[0] = local_238;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,__s,__s + sVar3);
  std::__cxx11::string::push_back((char)local_248);
  std::__cxx11::string::append((char *)local_248);
  __stream = fopen((char *)local_248[0],"rb");
  if (__stream == (FILE *)0x0) {
    GetTestData_abi_cxx11_();
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    sVar3 = fread(local_228,1,0x200,__stream);
    if (sVar3 != 0) {
      do {
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_228);
        sVar3 = fread(local_228,1,0x200,__stream);
      } while (sVar3 != 0);
    }
    iVar1 = feof(__stream);
    if (iVar1 != 0) {
      fclose(__stream);
      if (local_248[0] != local_238) {
        operator_delete(local_248[0],local_238[0] + 1);
      }
      return __return_storage_ptr__;
    }
  }
  GetTestData_abi_cxx11_();
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::string GetTestData(const char *path) {
#if defined(BORINGSSL_USE_BAZEL_RUNFILES)
  std::string error;
  std::unique_ptr<Runfiles> runfiles(
      Runfiles::CreateForTest(BAZEL_CURRENT_REPOSITORY, &error));
  if (runfiles == nullptr) {
    fprintf(stderr, "Could not initialize runfiles: %s\n", error.c_str());
    abort();
  }

  std::string full_path = runfiles->Rlocation(std::string("boringssl/") + path);
  if (full_path.empty()) {
    fprintf(stderr, "Could not find runfile '%s'.\n", path);
    abort();
  }
#else
  const char *root = getenv("BORINGSSL_TEST_DATA_ROOT");
  root = root != nullptr ? root : ".";

  std::string full_path = root;
  full_path.push_back('/');
  full_path.append(path);
#endif

  bssl::ScopedFILE file(fopen(full_path.c_str(), "rb"));
  if (file == nullptr) {
    fprintf(stderr, "Could not open '%s'.\n", full_path.c_str());
    abort();
  }

  std::string ret;
  for (;;) {
    char buf[512];
    size_t n = fread(buf, 1, sizeof(buf), file.get());
    if (n == 0) {
      if (feof(file.get())) {
        return ret;
      }
      fprintf(stderr, "Error reading from '%s'.\n", full_path.c_str());
      abort();
    }
    ret.append(buf, n);
  }
}